

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

bool __thiscall google::protobuf::internal::ExtensionSet::Extension::IsInitialized(Extension *this)

{
  int iVar1;
  Arena *pAVar2;
  bool bVar3;
  char cVar4;
  void *pvVar5;
  long lVar6;
  long lVar7;
  
  if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)this->type * 4) == 10) {
    if (this->is_repeated == true) {
      iVar1 = (((this->field_0).repeated_string_value)->super_RepeatedPtrFieldBase).current_size_;
      bVar3 = 0 < iVar1;
      if (0 < iVar1) {
        cVar4 = (**(code **)(*((((this->field_0).repeated_string_value)->super_RepeatedPtrFieldBase)
                              .rep_)->elements[0] + 0x40))();
        if (cVar4 != '\0') {
          lVar7 = 1;
          do {
            lVar6 = (long)(((this->field_0).repeated_string_value)->super_RepeatedPtrFieldBase).
                          current_size_;
            bVar3 = lVar7 < lVar6;
            if (lVar6 <= lVar7) {
              return true;
            }
            cVar4 = (**(code **)(*((((this->field_0).repeated_string_value)->
                                   super_RepeatedPtrFieldBase).rep_)->elements[lVar7] + 0x40))();
            lVar7 = lVar7 + 1;
          } while (cVar4 != '\0');
        }
        if (bVar3) {
          return false;
        }
      }
    }
    else if ((this->field_0xa & 1) == 0) {
      pAVar2 = (((this->field_0).repeated_string_value)->super_RepeatedPtrFieldBase).arena_;
      if ((this->field_0xa & 0x10) == 0) {
        cVar4 = (*(code *)(pAVar2->impl_).options_.initial_block_size)();
      }
      else {
        pvVar5 = (*(pAVar2->impl_).options_.block_alloc)
                           ((size_t)(this->field_0).repeated_string_value);
        cVar4 = (char)pvVar5;
      }
      if (cVar4 == '\0') {
        return false;
      }
    }
  }
  return true;
}

Assistant:

bool ExtensionSet::Extension::IsInitialized() const {
  if (cpp_type(type) == WireFormatLite::CPPTYPE_MESSAGE) {
    if (is_repeated) {
      for (int i = 0; i < repeated_message_value->size(); i++) {
        if (!repeated_message_value->Get(i).IsInitialized()) {
          return false;
        }
      }
    } else {
      if (!is_cleared) {
        if (is_lazy) {
          if (!lazymessage_value->IsInitialized()) return false;
        } else {
          if (!message_value->IsInitialized()) return false;
        }
      }
    }
  }
  return true;
}